

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Bus_ManStop(Bus_Man_t *p)

{
  Bus_Man_t *p_local;
  
  Vec_PtrFreeP(&p->vFanouts);
  Vec_FltFreeP(&p->vWireCaps);
  Vec_FltFreeP(&p->vCins);
  Vec_FltFreeP(&p->vETimes);
  Vec_FltFreeP(&p->vLoads);
  Vec_FltFreeP(&p->vDepts);
  if (p != (Bus_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Bus_ManStop( Bus_Man_t * p )
{
    Vec_PtrFreeP( &p->vFanouts );
    Vec_FltFreeP( &p->vWireCaps );
    Vec_FltFreeP( &p->vCins );
    Vec_FltFreeP( &p->vETimes );
    Vec_FltFreeP( &p->vLoads );
    Vec_FltFreeP( &p->vDepts );
    ABC_FREE( p );
}